

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

size_t __thiscall
MemoryLeakDetectorList::getTotalLeaks(MemoryLeakDetectorList *this,MemLeakPeriod period)

{
  size_t sVar1;
  MemoryLeakDetectorNode *pMVar2;
  ulong uVar3;
  
  sVar1 = 0;
  for (pMVar2 = this->head_; pMVar2 != (MemoryLeakDetectorNode *)0x0;
      pMVar2 = *(MemoryLeakDetectorNode **)(pMVar2 + 0x38)) {
    uVar3 = 1;
    if ((period != mem_leak_period_all) && (*(MemLeakPeriod *)(pMVar2 + 0x30) != period)) {
      uVar3 = (ulong)(*(MemLeakPeriod *)(pMVar2 + 0x30) != mem_leak_period_disabled &&
                     period == mem_leak_period_enabled);
    }
    sVar1 = sVar1 + uVar3;
  }
  return sVar1;
}

Assistant:

size_t MemoryLeakDetectorList::getTotalLeaks(MemLeakPeriod period)
{
    size_t total_leaks = 0;
    for (MemoryLeakDetectorNode* node = head_; node; node = node->next_) {
        if (isInPeriod(node, period)) total_leaks++;
    }
    return total_leaks;
}